

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O2

void __thiscall
TApp_IniNotRequiredPassedNotFound_Test::TestBody(TApp_IniNotRequiredPassedNotFound_Test *this)

{
  bool bVar1;
  long lVar2;
  allocator local_d9;
  AssertHelper local_d8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0 [4];
  string local_b0 [32];
  string local_90;
  string local_70;
  string local_50;
  string noini;
  
  std::__cxx11::string::string((string *)&noini,"TestIniNotExist.ini",(allocator *)local_d0);
  std::__cxx11::string::string((string *)&local_50,"--config",(allocator *)local_d0);
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_d8);
  std::__cxx11::string::string((string *)&local_90,"",&local_d9);
  CLI::App::set_config(&(this->super_TApp).app,&local_50,&local_70,&local_90,false);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)local_d0,"--config",(allocator *)&local_d8);
  std::__cxx11::string::string(local_b0,(string *)&noini);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,local_d0,&local_90);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_d0[0].ptr_ + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_d0);
  testing::internal::AssertHelper::AssertHelper
            (&local_d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
             ,0xfb,
             "Expected: run() throws an exception of type CLI::FileError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_d8,(Message *)local_d0);
  testing::internal::AssertHelper::~AssertHelper(&local_d8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_d0);
  std::__cxx11::string::~string((string *)&noini);
  return;
}

Assistant:

TEST_F(TApp, IniNotRequiredPassedNotFound) {

    std::string noini = "TestIniNotExist.ini";
    app.set_config("--config", "", "", false);

    args = {"--config", noini};
    EXPECT_THROW(run(), CLI::FileError);
}